

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandStrash(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  uint fCleanup;
  uint fAllNodes;
  char *pcVar6;
  uint local_44;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  fAllNodes = 0;
  Extra_UtilGetoptReset();
  fCleanup = 1;
  local_44 = 0;
  bVar1 = false;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"acrih"), iVar2 == 0x69) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 == -1) break;
    if (iVar2 == 0x72) {
      local_44 = local_44 ^ 1;
    }
    else if (iVar2 == 99) {
      fCleanup = fCleanup ^ 1;
    }
    else {
      if (iVar2 != 0x61) {
        iVar2 = -2;
        Abc_Print(-2,"usage: strash [-acrih]\n");
        Abc_Print(-2,"\t        transforms combinational logic into an AIG\n");
        pcVar6 = "all";
        pcVar5 = "all";
        if (fAllNodes == 0) {
          pcVar5 = "DFS";
        }
        Abc_Print(-2,"\t-a    : toggles between using all nodes and DFS nodes [default = %s]\n",
                  pcVar5);
        if (fCleanup == 0) {
          pcVar6 = "DFS";
        }
        Abc_Print(-2,"\t-c    : toggles cleanup to remove the dagling AIG nodes [default = %s]\n",
                  pcVar6);
        pcVar6 = "yes";
        pcVar5 = "yes";
        if (local_44 == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-r    : toggles using the record of AIG subgraphs [default = %s]\n",pcVar5);
        if (!bVar1) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-i    : toggles complementing the POs of the AIG [default = %s]\n",pcVar6);
        pcVar5 = "\t-h    : print the command usage\n";
LAB_001f2850:
        Abc_Print(iVar2,pcVar5);
        return 1;
      }
      fAllNodes = fAllNodes ^ 1;
    }
  }
  if (pAVar3 == (Abc_Ntk_t *)0x0) {
    pcVar5 = "Empty network.\n";
  }
  else {
    pAVar3 = Abc_NtkStrash(pAVar3,fAllNodes,fCleanup,local_44);
    if (pAVar3 != (Abc_Ntk_t *)0x0) {
      if (bVar1) {
        for (iVar2 = 0; iVar2 < pAVar3->vPos->nSize; iVar2 = iVar2 + 1) {
          pAVar4 = Abc_NtkPo(pAVar3,iVar2);
          pAVar4->field_0x15 = pAVar4->field_0x15 ^ 4;
        }
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
      return 0;
    }
    pcVar5 = "Strashing has failed.\n";
  }
  iVar2 = -1;
  goto LAB_001f2850;
}

Assistant:

int Abc_CommandStrash( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    Abc_Obj_t * pObj;
    int c;
    int fAllNodes;
    int fRecord;
    int fCleanup;
    int fComplOuts;
    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fAllNodes = 0;
    fCleanup  = 1;
    fRecord   = 0;
    fComplOuts= 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "acrih" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAllNodes ^= 1;
            break;
        case 'c':
            fCleanup ^= 1;
            break;
        case 'r':
            fRecord ^= 1;
            break;
        case 'i':
            fComplOuts ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkStrash( pNtk, fAllNodes, fCleanup, fRecord );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Strashing has failed.\n" );
        return 1;
    }
    if ( fComplOuts )
    Abc_NtkForEachPo( pNtkRes, pObj, c )
        Abc_ObjXorFaninC( pObj, 0 );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: strash [-acrih]\n" );
    Abc_Print( -2, "\t        transforms combinational logic into an AIG\n" );
    Abc_Print( -2, "\t-a    : toggles between using all nodes and DFS nodes [default = %s]\n", fAllNodes? "all": "DFS" );
    Abc_Print( -2, "\t-c    : toggles cleanup to remove the dagling AIG nodes [default = %s]\n", fCleanup? "all": "DFS" );
    Abc_Print( -2, "\t-r    : toggles using the record of AIG subgraphs [default = %s]\n", fRecord? "yes": "no" );
    Abc_Print( -2, "\t-i    : toggles complementing the POs of the AIG [default = %s]\n", fComplOuts? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}